

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

void __thiscall
GlobOpt::OptHoistInvariant
          (GlobOpt *this,Instr *instr,BasicBlock *block,Loop *loop,Value *dstVal,Value *src1Val,
          Value *src2Val,bool isNotTypeSpecConv,bool lossy,BailOutKind bailoutKind)

{
  undefined1 *puVar1;
  IRType IVar2;
  undefined2 valueType;
  long lVar3;
  ValueInfo *this_00;
  JitArenaAllocator *pJVar4;
  code *pcVar5;
  undefined1 auVar6 [8];
  OpndKind OVar7;
  bool bVar8;
  uint uVar9;
  BailOutKind BVar10;
  undefined4 *puVar11;
  StackSym *pSVar12;
  Value *pVVar13;
  StackSym *pSVar14;
  RegOpnd *this_01;
  StackSym *pSVar15;
  Instr *pIVar16;
  BasicBlock *pBVar17;
  ValueInfo *invariantValueInfoToHoist;
  Value *pVVar18;
  ulong uVar19;
  Type_conflict pBVar20;
  ValueInfo *pVVar21;
  Type_conflict pBVar22;
  ValueType *this_02;
  Opnd *pOVar23;
  GlobOptBlockData *pGVar24;
  ValueNumber VVar25;
  RegOpnd *this_03;
  BOOLEAN BVar26;
  undefined1 local_f8 [8];
  Opnd *src2;
  GlobOpt *local_e8;
  Loop **local_e0;
  BasicBlock *local_d8;
  Value *local_d0;
  Type_conflict local_c8;
  Type local_b8;
  Opnd *local_98;
  Opnd *src1;
  Value *landingPadSrc1val;
  StackSym *local_80;
  undefined1 local_78 [8];
  BasicBlock *block_local;
  Loop *local_68;
  Loop *loop_local;
  Value *local_58;
  Value *local_50;
  GlobOpt *local_48;
  undefined4 local_3c;
  Instr *local_38;
  Instr *instr_local;
  undefined7 extraout_var;
  
  block_local = loop->landingPad;
  local_98 = instr->m_src1;
  local_78 = (undefined1  [8])block;
  local_68 = loop;
  local_58 = dstVal;
  local_48 = this;
  local_38 = instr;
  if (local_98 != (Opnd *)0x0) {
    OptHoistUpdateValueType(this,loop,instr,&local_98,src1Val);
    OVar7 = IR::Opnd::GetKind(local_98);
    pOVar23 = local_98;
    if (OVar7 == OpndKindReg) {
      OVar7 = IR::Opnd::GetKind(local_98);
      if (OVar7 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar11 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar8) goto LAB_00464f15;
        *puVar11 = 0;
      }
      *(byte *)&pOVar23[1].m_valueType.field_0 = *(byte *)&pOVar23[1].m_valueType.field_0 & 0xfe;
    }
    local_f8 = (undefined1  [8])local_38->m_src2;
    if (local_f8 != (undefined1  [8])0x0) {
      OptHoistUpdateValueType(local_48,local_68,local_38,(Opnd **)local_f8,src2Val);
      OVar7 = IR::Opnd::GetKind((Opnd *)local_f8);
      auVar6 = local_f8;
      if (OVar7 == OpndKindReg) {
        OVar7 = IR::Opnd::GetKind((Opnd *)local_f8);
        if (OVar7 != OpndKindReg) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar11 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
          if (!bVar8) goto LAB_00464f15;
          *puVar11 = 0;
        }
        *(byte *)((long)auVar6 + 0x18) = *(byte *)((long)auVar6 + 0x18) & 0xfe;
      }
    }
  }
  this_03 = (RegOpnd *)local_38->m_dst;
  if (this_03 == (RegOpnd *)0x0) {
    this_03 = (RegOpnd *)0x0;
    pVVar13 = local_58;
  }
  else {
    OVar7 = IR::Opnd::GetKind((Opnd *)this_03);
    if (OVar7 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar11 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar8) goto LAB_00464f15;
      *puVar11 = 0;
    }
    if (local_38->m_opcode - 0x1d3 < 10) {
      lossy = lossy || (local_48->field_0xf7 & 2) == 0;
    }
    else if (local_38->m_opcode == FromVar) {
      pSVar12 = IR::RegOpnd::TryGetStackSym(local_38->m_src1);
      if ((local_38->field_0x38 & 0x10) == 0) {
        if ((pSVar12 != (StackSym *)0x0) && (bailoutKind != BailOutInvalid)) {
          if ((pSVar12->field_0x1a & 1) != 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar11 = 1;
            bVar8 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0x3b26,"(!src1StackSym->IsTypeSpec())","!src1StackSym->IsTypeSpec()"
                              );
            if (!bVar8) goto LAB_00464f15;
            *puVar11 = 0;
          }
          pGVar24 = &block_local->globOptData;
          src1 = (Opnd *)GlobOptBlockData::FindValue(pGVar24,&pSVar12->super_Sym);
          if (src1Val->valueNumber != *(ValueNumber *)&src1->_vptr_Opnd) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar11 = 1;
            bVar8 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0x3b28,
                               "(src1Val->GetValueNumber() == landingPadSrc1val->GetValueNumber())",
                               "src1Val->GetValueNumber() == landingPadSrc1val->GetValueNumber()");
            if (!bVar8) goto LAB_00464f15;
            *puVar11 = 0;
          }
          lVar3 = *(long *)&src1->m_valueType;
          IVar2 = (this_03->super_Opnd).m_type;
          local_f8 = (undefined1  [8])&stack0xffffffffffffffc8;
          src2 = (Opnd *)&src1;
          local_e8 = local_48;
          local_e0 = &stack0xffffffffffffff98;
          local_d8 = (BasicBlock *)local_78;
          local_d0 = (Value *)&bailoutKind;
          if (IVar2 == TyFloat64) {
            bVar8 = ValueType::IsNumber(&src1Val->valueInfo->super_ValueType);
            if (bVar8) {
              bVar8 = ValueType::IsNumber((ValueType *)(lVar3 + 8));
LAB_00464e9d:
              if (bVar8 == false) {
LAB_00464ea1:
                OptHoistInvariant::anon_class_48_6_64df1e2e::operator()
                          ((anon_class_48_6_64df1e2e *)local_f8);
              }
            }
          }
          else if (IVar2 == TyInt32) {
            this_02 = &src1Val->valueInfo->super_ValueType;
            if (lossy) {
              bVar8 = ValueType::IsPrimitive(this_02);
              if ((((bVar8) ||
                   (bVar8 = GlobOptBlockData::IsTypeSpecialized
                                      ((GlobOptBlockData *)((long)local_78 + 0xd0),
                                       &pSVar12->super_Sym), bVar8)) &&
                  (bVar8 = ValueType::IsPrimitive((ValueType *)(lVar3 + 8)), !bVar8)) &&
                 (bVar8 = GlobOptBlockData::IsTypeSpecialized(pGVar24,&pSVar12->super_Sym), !bVar8))
              {
                bailoutKind = BailOutOnNotPrimitive;
                goto LAB_00464ea1;
              }
            }
            else {
              bVar8 = ValueType::IsInt(this_02);
              if (bVar8) {
                bVar8 = ValueType::IsInt((ValueType *)(lVar3 + 8));
                goto LAB_00464e9d;
              }
            }
          }
        }
      }
      else {
        BVar10 = IR::Instr::GetBailOutKind(local_38);
        if ((BailOutExpectingInteger < BVar10) ||
           ((0x40004eU >> (BVar10 & BailOnDivResultNotInt) & 1) == 0)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar11 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0x3b20,
                             "(instrBailoutKind == IR::BailOutIntOnly || instrBailoutKind == IR::BailOutExpectingInteger || instrBailoutKind == IR::BailOutOnNotPrimitive || instrBailoutKind == IR::BailOutNumberOnly || instrBailoutKind == IR::BailOutPrimitiveButString)"
                             ,
                             "instrBailoutKind == IR::BailOutIntOnly || instrBailoutKind == IR::BailOutExpectingInteger || instrBailoutKind == IR::BailOutOnNotPrimitive || instrBailoutKind == IR::BailOutNumberOnly || instrBailoutKind == IR::BailOutPrimitiveButString"
                            );
          if (!bVar8) goto LAB_00464f15;
          *puVar11 = 0;
        }
      }
    }
    if (local_58 == (Value *)0x0) {
      local_58 = NewGenericValue(local_48,(ValueType)0x9,(Opnd *)this_03);
    }
    loop_local = (Loop *)CONCAT71(loop_local._1_7_,lossy);
    if (isNotTypeSpecConv) {
      bVar8 = false;
    }
    else {
      bVar8 = local_38->m_opcode != LdC_A_I4;
    }
    pSVar12 = this_03->m_sym;
    if ((pSVar12->field_0x1a & 1) != 0) {
      pSVar12 = StackSym::GetVarEquivSym(pSVar12,local_48->func);
    }
    pVVar13 = GlobOptBlockData::FindValue(&local_68->landingPad->globOptData,&pSVar12->super_Sym);
    if (pVVar13 == (Value *)0x0) {
      BVar26 = BVSparse<Memory::JitArenaAllocator>::Test
                         (local_68->symsDefInLoop,(pSVar12->super_Sym).m_id);
    }
    else {
      BVar26 = local_58->valueNumber != pVVar13->valueNumber;
    }
    if (!(bool)(BVar26 == '\0' & bVar8)) {
      uVar9 = *(uint *)&this_03->m_sym->field_0x18;
      if ((uVar9 >> 0x10 & 1) != 0) {
        pSVar14 = StackSym::GetVarEquivSym(this_03->m_sym,local_48->func);
        uVar9 = *(uint *)&pSVar14->field_0x18;
      }
      if ((uVar9 & 1) == 0) {
        IR::Instr::UnlinkDst(local_38);
        local_50 = src1Val;
        if ((this_03->m_sym->field_0x1a & 1) == 0) {
          this_01 = IR::RegOpnd::New((this_03->super_Opnd).m_type,local_38->m_func);
          pSVar14 = this_01->m_sym;
          BVSparse<Memory::JitArenaAllocator>::Set
                    (((GlobOptBlockData *)((long)local_78 + 0xd0))->liveVarSyms,
                     (pSVar14->super_Sym).m_id);
        }
        else {
          pSVar14 = StackSym::New(TyVar,local_38->m_func);
          IVar2 = this_03->m_sym->m_type;
          if (IVar2 == TyFloat64) {
            BVSparse<Memory::JitArenaAllocator>::Set
                      (((GlobOptBlockData *)((long)local_78 + 0xd0))->liveFloat64Syms,
                       (pSVar14->super_Sym).m_id);
            pSVar15 = StackSym::GetFloat64EquivSym(pSVar14,local_38->m_func);
          }
          else {
            pSVar15 = pSVar14;
            if (IVar2 == TyInt32) {
              if ((byte)loop_local == '\0') {
                BVSparse<Memory::JitArenaAllocator>::Set
                          (((GlobOptBlockData *)((long)local_78 + 0xd0))->liveInt32Syms,
                           (pSVar14->super_Sym).m_id);
              }
              pSVar15 = StackSym::GetInt32EquivSym(pSVar14,local_38->m_func);
            }
          }
          this_01 = IR::RegOpnd::New(pSVar15,pSVar15->m_type,local_38->m_func);
        }
        valueType = (this_03->super_Opnd).m_valueType;
        IR::Opnd::SetValueType(&this_01->super_Opnd,(ValueType)valueType);
        pIVar16 = IR::Instr::New(Ld_A,(Opnd *)this_03,&this_01->super_Opnd,local_38->m_func);
        IR::Instr::SetByteCodeOffset(pIVar16,local_38);
        IR::Instr::SetDst(local_38,&this_01->super_Opnd);
        IR::Instr::InsertBefore(local_38,pIVar16);
        puVar1 = &this_03->m_sym->field_0x18;
        *(uint *)puVar1 = *(uint *)puVar1 | 0x80000;
        pOVar23 = local_38->m_src1;
        if (((pOVar23 != (Opnd *)0x0) &&
            (((OVar7 = IR::Opnd::GetKind(pOVar23), OVar7 == OpndKindIntConst ||
              (OVar7 = IR::Opnd::GetKind(pOVar23), OVar7 == OpndKindInt64Const)) ||
             ((OVar7 = IR::Opnd::GetKind(pOVar23), OVar7 == OpndKindAddr ||
              (OVar7 = IR::Opnd::GetKind(pOVar23), OVar7 == OpndKindHelperCall)))))) &&
           ((local_38->m_opcode - 0x1e4 < 2 || (local_38->m_opcode == Ld_A)))) {
          StackSym::SetIsConst(this_01->m_sym);
        }
        pVVar13 = local_58;
        pVVar21 = local_58->valueInfo;
        pSVar15 = (StackSym *)pVVar21->symStore;
        lossy = (bool)(byte)loop_local;
        if (pSVar15 == (StackSym *)0x0) {
          if ((byte)loop_local == 0) goto LAB_00464434;
        }
        else if (pSVar15 == pSVar12 && (byte)loop_local == 0) {
LAB_00464434:
          GlobOptBlockData::SetChangedSym(&local_48->currentBlock->globOptData,(Sym *)pSVar15);
          ValueInfo::SetSymStore(pVVar21,&pSVar14->super_Sym);
        }
        GlobOptBlockData::InsertNewValue
                  ((GlobOptBlockData *)((long)local_78 + 0xd0),pVVar13,&this_01->super_Opnd);
        src1Val = local_50;
        this_03 = this_01;
        goto LAB_0046446c;
      }
    }
    pVVar13 = local_58;
    lossy = (bool)(byte)loop_local;
  }
LAB_0046446c:
  BasicBlock::UnlinkInstr((BasicBlock *)local_78,local_38);
  pIVar16 = local_68->bailOutInfo->bailOutInstr;
  if (pIVar16 == (Instr *)0x0) {
    BasicBlock::InsertAfter(block_local,local_38);
  }
  else {
    IR::Instr::InsertBefore(pIVar16,local_38);
  }
  MarkNonByteCodeUsed(local_38);
  if ((local_38->field_0x38 & 0x50) != 0) {
    if (local_68->bailOutInfo == (BailOutInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar11 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x3bcd,"(loop->bailOutInfo)","loop->bailOutInfo");
      if (!bVar8) goto LAB_00464f15;
      *puVar11 = 0;
    }
    EnsureBailTarget(local_48,local_68);
    IR::Instr::ReplaceBailOutInfo(local_38,local_68->bailOutInfo);
  }
  if (this_03 == (RegOpnd *)0x0) {
    return;
  }
  block_local = (BasicBlock *)this_03->m_sym;
  loop_local = (Loop *)block_local;
  if (((block_local->field_0x1a & 1) != 0) &&
     (block_local = (BasicBlock *)StackSym::GetVarEquivSym((StackSym *)block_local,(Func *)0x0),
     block_local == (BasicBlock *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3be0,"(dstVarSym)","dstVarSym");
    if (!bVar8) goto LAB_00464f15;
    *puVar11 = 0;
    block_local = (BasicBlock *)0x0;
  }
  if ((isNotTypeSpecConv) ||
     (bVar8 = GlobOptBlockData::IsLive(&local_68->landingPad->globOptData,(Sym *)block_local),
     !bVar8)) {
    if (lossy != false) {
      if ((loop_local->loopNumber & 0x10000) == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar11 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x3bed,"(dstSym->IsTypeSpec())","dstSym->IsTypeSpec()");
        if (!bVar8) goto LAB_00464f15;
        *puVar11 = 0;
      }
      if (loop_local->field_0x1c == '\x03') {
        return;
      }
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar11 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x3bee,"(dstSym->IsInt32())","dstSym->IsInt32()");
      if (bVar8) {
        *puVar11 = 0;
        return;
      }
      goto LAB_00464f15;
    }
    local_3c = CONCAT31(local_3c._1_3_,pVVar13 == src1Val);
    if (pVVar13 == src1Val) {
      pOVar23 = local_38->m_src1;
      if (pOVar23 == (Opnd *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar11 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x3bf8,"(instr->GetSrc1())","instr->GetSrc1()");
        if (!bVar8) goto LAB_00464f15;
        *puVar11 = 0;
        pOVar23 = local_38->m_src1;
      }
      OVar7 = IR::Opnd::GetKind(pOVar23);
      if (OVar7 != OpndKindReg) goto LAB_00464acf;
      pOVar23 = local_38->m_src1;
      OVar7 = IR::Opnd::GetKind(pOVar23);
      if (OVar7 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar11 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar8) goto LAB_00464f15;
        *puVar11 = 0;
      }
      pSVar12 = (StackSym *)pOVar23[1]._vptr_Opnd;
      if (((pSVar12->field_0x1a & 1) != 0) &&
         (pSVar12 = StackSym::GetVarEquivSym(pSVar12,(Func *)0x0), pSVar12 == (StackSym *)0x0)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar11 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x3bff,"(src1Sym)","src1Sym");
        if (!bVar8) goto LAB_00464f15;
        *puVar11 = 0;
        pSVar12 = (StackSym *)0x0;
      }
      pVVar18 = GlobOptBlockData::FindValue
                          ((GlobOptBlockData *)((long)local_78 + 0xd0),&pSVar12->super_Sym);
      local_80 = (StackSym *)0x0;
      if (pVVar18 == src1Val) {
        local_80 = pSVar12;
      }
    }
    else {
LAB_00464acf:
      local_80 = (StackSym *)0x0;
    }
    if (local_38->m_opcode == ExtendArg_A) {
      if (local_38->m_src1 == (Opnd *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar11 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x3c0c,"(instr->GetSrc1())","instr->GetSrc1()");
        if (!bVar8) goto LAB_00464f15;
        *puVar11 = 0;
      }
      pSVar12 = (StackSym *)pVVar13->valueInfo->symStore;
      pSVar14 = IR::Opnd::GetStackSym(local_38->m_dst);
      if (pSVar12 != pSVar14) {
        local_80 = (StackSym *)pVVar13->valueInfo->symStore;
        local_3c = CONCAT31(local_3c._1_3_,1);
        if ((local_80->super_Sym).m_kind != SymKindStack) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar11 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                             ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
          if (!bVar8) {
LAB_00464f15:
            pcVar5 = (code *)invalidInstructionException();
            (*pcVar5)();
          }
          *puVar11 = 0;
        }
      }
    }
    landingPadSrc1val._4_4_ = pVVar13->valueNumber;
    VVar25 = 0;
    local_58 = pVVar13;
    InvariantBlockBackwardIterator::InvariantBlockBackwardIterator
              ((InvariantBlockBackwardIterator *)local_f8,local_48,(BasicBlock *)local_78,
               local_68->landingPad,(StackSym *)0x0,0,false);
    local_50 = (Value *)__tls_get_addr(&PTR_01548f08);
    landingPadSrc1val._0_4_ = 0;
    while (local_d8 != (BasicBlock *)src2) {
      pBVar17 = InvariantBlockBackwardIterator::Block((InvariantBlockBackwardIterator *)local_f8);
      pGVar24 = &pBVar17->globOptData;
      bVar8 = GlobOptBlockData::IsLive(pGVar24,(Sym *)block_local);
      if (bVar8) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        local_50->valueNumber = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x3c1d,"(!hoistBlockData.IsLive(dstVarSym))",
                           "!hoistBlockData.IsLive(dstVarSym)");
        if (!bVar8) goto LAB_00464f15;
        local_50->valueNumber = 0;
      }
      GlobOptBlockData::MakeLive(pGVar24,(StackSym *)loop_local,false);
      if ((char)local_3c == '\0') {
        pJVar4 = local_48->alloc;
        ValueInfo::SetIsShared(local_58->valueInfo);
        pVVar21 = local_58->valueInfo;
        pVVar13 = (Value *)new<Memory::JitArenaAllocator>(0x10,pJVar4,0x3eba5c);
        pVVar13->valueNumber = landingPadSrc1val._4_4_;
LAB_00464d72:
        pVVar13->valueInfo = pVVar21;
      }
      else if (((local_80 == (StackSym *)0x0) ||
               (pVVar13 = GlobOptBlockData::FindValue(pGVar24,&local_80->super_Sym),
               pVVar13 == (Value *)0x0)) || (pVVar13->valueNumber != landingPadSrc1val._4_4_)) {
        if (VVar25 == (ValueNumber)landingPadSrc1val) {
          VVar25 = local_48->currentValue;
          local_48->currentValue = VVar25 + 1;
          if (VVar25 == 0) {
            Js::Throw::OutOfMemory();
          }
        }
        pJVar4 = local_48->alloc;
        ValueInfo::SetIsShared(local_58->valueInfo);
        pVVar21 = local_58->valueInfo;
        pVVar13 = (Value *)new<Memory::JitArenaAllocator>(0x10,pJVar4,0x3eba5c);
        pVVar13->valueNumber = VVar25;
        goto LAB_00464d72;
      }
      GlobOptBlockData::SetValue(pGVar24,pVVar13,(Sym *)block_local);
      InvariantBlockBackwardIterator::MoveNext((InvariantBlockBackwardIterator *)local_f8);
    }
    if (local_c8 == (Type_conflict)0x0) {
      return;
    }
    pBVar20 = local_b8->bvFreeList;
    do {
      pBVar22 = local_c8;
      local_c8 = pBVar22->next;
      pBVar22->next = pBVar20;
      pBVar20 = pBVar22;
    } while (local_c8 != (Type)0x0);
    goto LAB_00464dea;
  }
  OVar7 = IR::Opnd::GetKind(local_38->m_src1);
  if (OVar7 == OpndKindReg) {
    pOVar23 = local_38->m_src1;
    OVar7 = IR::Opnd::GetKind(pOVar23);
    if (OVar7 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar11 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar8) goto LAB_00464f15;
      *puVar11 = 0;
    }
    pBVar17 = (BasicBlock *)pOVar23[1]._vptr_Opnd;
    if (pBVar17 == (BasicBlock *)loop_local) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar11 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x3c44,"(srcSym != dstSym)","srcSym != dstSym");
      if (!bVar8) goto LAB_00464f15;
      *puVar11 = 0;
    }
    if ((pBVar17->field_0x1a & 1) != 0) {
      pBVar17 = (BasicBlock *)StackSym::GetVarEquivSym((StackSym *)pBVar17,(Func *)0x0);
    }
    if (pBVar17 != block_local) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar11 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x3c46,"(srcVarSym == dstVarSym)","srcVarSym == dstVarSym");
      if (!bVar8) goto LAB_00464f15;
      *puVar11 = 0;
    }
  }
  if ((loop_local->loopNumber & 0x10000) == 0) {
LAB_00464764:
    local_3c = 0;
LAB_0046476b:
    local_50 = (Value *)((ulong)local_50 & 0xffffffff00000000);
  }
  else {
    IVar2 = (this_03->super_Opnd).m_type;
    if (IVar2 == TyFloat64) {
      if ((local_38->field_0x38 & 0x10) == 0) goto LAB_00464764;
      BVar10 = IR::Instr::GetBailOutKind(local_38);
      local_3c = CONCAT31((int3)(BVar10 >> 8),BVar10 == BailOutNumberOnly);
      goto LAB_0046476b;
    }
    if ((IVar2 != TyInt32) || (lossy != false)) goto LAB_00464764;
    uVar19 = 0;
    local_3c = 1;
    if ((local_38->field_0x38 & 0x10) != 0) {
      BVar10 = IR::Instr::GetBailOutKind(local_38);
      uVar19 = (ulong)BVar10;
      if (BVar10 != BailOutIntOnly) {
        BVar10 = IR::Instr::GetBailOutKind(local_38);
        uVar19 = (ulong)BVar10;
        if (BVar10 != BailOutExpectingInteger) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar11 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0x3c54,
                             "(!instr->HasBailOutInfo() || instr->GetBailOutKind() == IR::BailOutIntOnly || instr->GetBailOutKind() == IR::BailOutExpectingInteger)"
                             ,
                             "!instr->HasBailOutInfo() || instr->GetBailOutKind() == IR::BailOutIntOnly || instr->GetBailOutKind() == IR::BailOutExpectingInteger"
                            );
          uVar19 = CONCAT71(extraout_var,bVar8);
          if (!bVar8) goto LAB_00464f15;
          *puVar11 = 0;
        }
      }
    }
    local_50 = (Value *)CONCAT44(local_50._4_4_,(int)CONCAT71((int7)(uVar19 >> 8),1));
  }
  InvariantBlockBackwardIterator::InvariantBlockBackwardIterator
            ((InvariantBlockBackwardIterator *)local_f8,local_48,(BasicBlock *)local_78,
             local_68->landingPad,(StackSym *)block_local,pVVar13->valueNumber,false);
  pVVar21 = (ValueInfo *)0x0;
  local_58 = (Value *)CONCAT44(local_58._4_4_,(uint)lossy);
  invariantValueInfoToHoist = (ValueInfo *)0x0;
  while (local_d8 != (BasicBlock *)src2) {
    pBVar17 = InvariantBlockBackwardIterator::Block((InvariantBlockBackwardIterator *)local_f8);
    GlobOptBlockData::MakeLive(&pBVar17->globOptData,(StackSym *)loop_local,SUB81(local_58,0));
    if ((char)local_3c != '\0') {
      pVVar13 = InvariantBlockBackwardIterator::InvariantSymValue
                          ((InvariantBlockBackwardIterator *)local_f8);
      this_00 = pVVar13->valueInfo;
      if (this_00 == pVVar21) {
        if (pVVar21 != invariantValueInfoToHoist) {
          HoistInvariantValueInfo(local_48,invariantValueInfoToHoist,pVVar13,pBVar17);
        }
      }
      else {
        if ((char)local_50 == '\0') {
          invariantValueInfoToHoist = ValueInfo::SpecializeToFloat64(this_00,local_48->alloc);
        }
        else {
          invariantValueInfoToHoist = ValueInfo::SpecializeToInt32(this_00,local_48->alloc,false);
          pBVar17 = (BasicBlock *)0x0;
        }
        ChangeValueInfo(local_48,pBVar17,pVVar13,invariantValueInfoToHoist,false,false);
        pVVar21 = this_00;
      }
    }
    InvariantBlockBackwardIterator::MoveNext((InvariantBlockBackwardIterator *)local_f8);
  }
  if (local_c8 == (Type_conflict)0x0) {
    return;
  }
  pBVar20 = local_b8->bvFreeList;
  do {
    pBVar22 = local_c8;
    local_c8 = pBVar22->next;
    pBVar22->next = pBVar20;
    pBVar20 = pBVar22;
  } while (local_c8 != (Type)0x0);
LAB_00464dea:
  local_b8->bvFreeList = pBVar22;
  return;
}

Assistant:

void
GlobOpt::OptHoistInvariant(
    IR::Instr *instr,
    BasicBlock *block,
    Loop *loop,
    Value *dstVal,
    Value *const src1Val,
    Value *const src2Val,
    bool isNotTypeSpecConv,
    bool lossy,
    IR::BailOutKind bailoutKind)
{
    BasicBlock *landingPad = loop->landingPad;

    IR::Opnd* src1 = instr->GetSrc1();
    if (src1)
    {
        // We are hoisting this instruction possibly past other uses, which might invalidate the last use info. Clear it.
        OptHoistUpdateValueType(loop, instr, &src1, src1Val);

        if (src1->IsRegOpnd())
        {
            src1->AsRegOpnd()->m_isTempLastUse = false;
        }

        IR::Opnd* src2 = instr->GetSrc2();
        if (src2)
        {
            OptHoistUpdateValueType(loop, instr, &src2, src2Val);

            if (src2->IsRegOpnd())
            {
                src2->AsRegOpnd()->m_isTempLastUse = false;
            }
        }
    }

    IR::RegOpnd *dst = instr->GetDst() ? instr->GetDst()->AsRegOpnd() : nullptr;
    if(dst)
    {
        switch (instr->m_opcode)
        {
        case Js::OpCode::CmEq_I4:
        case Js::OpCode::CmNeq_I4:
        case Js::OpCode::CmLt_I4:
        case Js::OpCode::CmLe_I4:
        case Js::OpCode::CmGt_I4:
        case Js::OpCode::CmGe_I4:
        case Js::OpCode::CmUnLt_I4:
        case Js::OpCode::CmUnLe_I4:
        case Js::OpCode::CmUnGt_I4:
        case Js::OpCode::CmUnGe_I4:
            // These operations are a special case. They generate a lossy int value, and the var sym is initialized using
            // Conv_Bool. A sym cannot be live only as a lossy int sym, the var needs to be live as well since the lossy int
            // sym cannot be used to convert to var. We don't know however, whether the Conv_Bool will be hoisted. The idea
            // currently is that the sym is only used on the path in which it is initialized inside the loop. So, don't
            // hoist any liveness info for the dst.
            if (!this->GetIsAsmJSFunc())
            {
                lossy = true;
            }
            break;

        case Js::OpCode::FromVar:
        {
            StackSym* src1StackSym = IR::RegOpnd::TryGetStackSym(instr->GetSrc1());

            if (instr->HasBailOutInfo())
            {
                IR::BailOutKind instrBailoutKind = instr->GetBailOutKind();
                Assert(instrBailoutKind == IR::BailOutIntOnly ||
                    instrBailoutKind == IR::BailOutExpectingInteger ||
                    instrBailoutKind == IR::BailOutOnNotPrimitive ||
                    instrBailoutKind == IR::BailOutNumberOnly ||
                    instrBailoutKind == IR::BailOutPrimitiveButString);
            }
            else if (src1StackSym && bailoutKind != IR::BailOutInvalid)
            {
                // We may be hoisting FromVar from a region where it didn't need a bailout (src1 had a definite value type) to a region
                // where it would. In such cases, the FromVar needs a bailout based on the value type of src1 in its new position.
                Assert(!src1StackSym->IsTypeSpec());
                Value* landingPadSrc1val = landingPad->globOptData.FindValue(src1StackSym);
                Assert(src1Val->GetValueNumber() == landingPadSrc1val->GetValueNumber());

                ValueInfo *src1ValueInfo = src1Val->GetValueInfo();
                ValueInfo *landingPadSrc1ValueInfo = landingPadSrc1val->GetValueInfo();
                IRType dstType = dst->GetType();

                const auto AddBailOutToFromVar = [&]()
                {
                    instr->GetSrc1()->SetValueType(landingPadSrc1val->GetValueInfo()->Type());
                    EnsureBailTarget(loop);
                    if (block->IsLandingPad())
                    {
                        instr = instr->ConvertToBailOutInstr(instr, bailoutKind, loop->bailOutInfo->bailOutOffset);
                    }
                    else
                    {
                        instr = instr->ConvertToBailOutInstr(instr, bailoutKind);
                    }
                };

                // A definite type in the source position and not a definite type in the destination (landing pad)
                // and no bailout on the instruction; we should put a bailout on the hoisted instruction.
                if (dstType == TyInt32)
                {
                    if (lossy)
                    {
                        if ((src1ValueInfo->IsPrimitive() || block->globOptData.IsTypeSpecialized(src1StackSym)) &&                // didn't need a lossy type spec bailout in the source block
                            (!landingPadSrc1ValueInfo->IsPrimitive() && !landingPad->globOptData.IsTypeSpecialized(src1StackSym))) // needs a lossy type spec bailout in the landing pad
                        {
                            bailoutKind = IR::BailOutOnNotPrimitive;
                            AddBailOutToFromVar();
                        }
                    }
                    else if (src1ValueInfo->IsInt() && !landingPadSrc1ValueInfo->IsInt())
                    {
                        AddBailOutToFromVar();
                    }
                }
                else if ((dstType == TyFloat64 && src1ValueInfo->IsNumber() && !landingPadSrc1ValueInfo->IsNumber()))
                {
                    AddBailOutToFromVar();
                }
            }

            break;
        }
        }

        if (dstVal == NULL)
        {
            dstVal = this->NewGenericValue(ValueType::Uninitialized, dst);
        }

        // ToVar/FromVar don't need a new dst because it has to be invariant if their src is invariant.
        bool dstDoesntNeedLoad = (!isNotTypeSpecConv && instr->m_opcode != Js::OpCode::LdC_A_I4);

        StackSym *varSym = dst->m_sym;

        if (varSym->IsTypeSpec())
        {
            varSym = varSym->GetVarEquivSym(this->func);
        }

        Value *const landingPadDstVal = loop->landingPad->globOptData.FindValue(varSym);
        if(landingPadDstVal
                ? dstVal->GetValueNumber() != landingPadDstVal->GetValueNumber()
                : loop->symsDefInLoop->Test(varSym->m_id))
        {
            // We need a temp for FromVar/ToVar if dst changes in the loop.
            dstDoesntNeedLoad = false;
        }

        if (!dstDoesntNeedLoad && this->OptDstIsInvariant(dst) == false)
        {
            // Keep dst in place, hoist instr using a new dst.
            instr->UnlinkDst();

            // Set type specialization info correctly for this new sym
            StackSym *copyVarSym;
            IR::RegOpnd *copyReg;
            if (dst->m_sym->IsTypeSpec())
            {
                copyVarSym = StackSym::New(TyVar, instr->m_func);
                StackSym *copySym = copyVarSym;
                if (dst->m_sym->IsInt32())
                {
                    if(lossy)
                    {
                        // The new sym would only be live as a lossy int since we're only hoisting the store to the int version
                        // of the sym, and cannot be converted to var. It is not legal to have a sym only live as a lossy int,
                        // so don't update liveness info for this sym.
                    }
                    else
                    {
                        block->globOptData.liveInt32Syms->Set(copyVarSym->m_id);
                    }
                    copySym = copySym->GetInt32EquivSym(instr->m_func);
                }
                else if (dst->m_sym->IsFloat64())
                {
                    block->globOptData.liveFloat64Syms->Set(copyVarSym->m_id);
                    copySym = copySym->GetFloat64EquivSym(instr->m_func);
                }
                copyReg = IR::RegOpnd::New(copySym, copySym->GetType(), instr->m_func);
            }
            else
            {
                copyReg = IR::RegOpnd::New(dst->GetType(), instr->m_func);
                copyVarSym = copyReg->m_sym;
                block->globOptData.liveVarSyms->Set(copyVarSym->m_id);
            }

            copyReg->SetValueType(dst->GetValueType());
            IR::Instr *copyInstr = IR::Instr::New(Js::OpCode::Ld_A, dst, copyReg, instr->m_func);
            copyInstr->SetByteCodeOffset(instr);
            instr->SetDst(copyReg);
            instr->InsertBefore(copyInstr);

            dst->m_sym->m_mayNotBeTempLastUse = true;

            if (instr->GetSrc1() && instr->GetSrc1()->IsImmediateOpnd())
            {
                // Propagate IsIntConst if appropriate
                switch(instr->m_opcode)
                {
                case Js::OpCode::Ld_A:
                case Js::OpCode::Ld_I4:
                case Js::OpCode::LdC_A_I4:
                    copyReg->m_sym->SetIsConst();
                    break;
                }
            }

            ValueInfo *dstValueInfo = dstVal->GetValueInfo();
            if((!dstValueInfo->GetSymStore() || dstValueInfo->GetSymStore() == varSym) && !lossy)
            {
                // The destination's value may have been transferred from one of the invariant sources, in which case we should
                // keep the sym store intact, as that sym will likely have a better lifetime than this new copy sym. For
                // instance, if we're inside a conditioned block, because we don't make the copy sym live and set its value in
                // all preceding blocks, this sym would not be live after exiting this block, causing this value to not
                // participate in copy-prop after this block.
                this->SetSymStoreDirect(dstValueInfo, copyVarSym);
            }

            block->globOptData.InsertNewValue(dstVal, copyReg);
            dst = copyReg;
        }
    }

    // Move to landing pad
    block->UnlinkInstr(instr);

    if (loop->bailOutInfo->bailOutInstr)
    {
        loop->bailOutInfo->bailOutInstr->InsertBefore(instr);
    }
    else
    {
        landingPad->InsertAfter(instr);
    }

    GlobOpt::MarkNonByteCodeUsed(instr);

    if (instr->HasBailOutInfo() || instr->HasAuxBailOut())
    {
        Assert(loop->bailOutInfo);
        EnsureBailTarget(loop);

        // Copy bailout info of loop top.
        instr->ReplaceBailOutInfo(loop->bailOutInfo);
    }

    if(!dst)
    {
        return;
    }

    // The bailout info's liveness for the dst sym is not updated in loop landing pads because bailout instructions previously
    // hoisted into the loop's landing pad may bail out before the current type of the dst sym became live (perhaps due to this
    // instruction). Since the landing pad will have a shared bailout point, the bailout info cannot assume that the current
    // type of the dst sym was live during every bailout hoisted into the landing pad.

    StackSym *const dstSym = dst->m_sym;
    StackSym *const dstVarSym = dstSym->IsTypeSpec() ? dstSym->GetVarEquivSym(nullptr) : dstSym;
    Assert(dstVarSym);
    if(isNotTypeSpecConv || !loop->landingPad->globOptData.IsLive(dstVarSym))
    {
        // A new dst is being hoisted, or the same single-def dst that would not be live before this block. So, make it live and
        // update the value info with the same value info in this block.

        if(lossy)
        {
            // This is a lossy conversion to int. The instruction was given a new dst specifically for hoisting, so this new dst
            // will not be live as a var before this block. A sym cannot be live only as a lossy int sym, the var needs to be
            // live as well since the lossy int sym cannot be used to convert to var. Since the var version of the sym is not
            // going to be initialized, don't hoist any liveness info for the dst. The sym is only going to be used on the path
            // in which it is initialized inside the loop.
            Assert(dstSym->IsTypeSpec());
            Assert(dstSym->IsInt32());
            return;
        }

        // Check if the dst value was transferred from the src. If so, the value transfer needs to be replicated.
        bool isTransfer = dstVal == src1Val;

        StackSym *transferValueOfSym = nullptr;
        if(isTransfer)
        {
            Assert(instr->GetSrc1());
            if(instr->GetSrc1()->IsRegOpnd())
            {
                StackSym *src1Sym = instr->GetSrc1()->AsRegOpnd()->m_sym;
                if(src1Sym->IsTypeSpec())
                {
                    src1Sym = src1Sym->GetVarEquivSym(nullptr);
                    Assert(src1Sym);
                }
                if(dstVal == block->globOptData.FindValue(src1Sym))
                {
                    transferValueOfSym = src1Sym;
                }
            }
        }

        // SIMD_JS
        if (instr->m_opcode == Js::OpCode::ExtendArg_A)
        {
            // Check if we should have CSE'ed this EA
            Assert(instr->GetSrc1());

            // If the dstVal symstore is not the dst itself, then we copied the Value from another expression.
            if (dstVal->GetValueInfo()->GetSymStore() != instr->GetDst()->GetStackSym())
            {
                isTransfer = true;
                transferValueOfSym = dstVal->GetValueInfo()->GetSymStore()->AsStackSym();
            }
        }

        const ValueNumber dstValueNumber = dstVal->GetValueNumber();
        ValueNumber dstNewValueNumber = InvalidValueNumber;
        for(InvariantBlockBackwardIterator it(this, block, loop->landingPad, nullptr); it.IsValid(); it.MoveNext())
        {
            BasicBlock *const hoistBlock = it.Block();
            GlobOptBlockData &hoistBlockData = hoistBlock->globOptData;

            Assert(!hoistBlockData.IsLive(dstVarSym));
            hoistBlockData.MakeLive(dstSym, lossy);

            Value *newDstValue;
            do
            {
                if(isTransfer)
                {
                    if(transferValueOfSym)
                    {
                        newDstValue = hoistBlockData.FindValue(transferValueOfSym);
                        if(newDstValue && newDstValue->GetValueNumber() == dstValueNumber)
                        {
                            break;
                        }
                    }

                    // It's a transfer, but we don't have a sym whose value number matches in the target block. Use a new value
                    // number since we don't know if there is already a value with the current number for the target block.
                    if(dstNewValueNumber == InvalidValueNumber)
                    {
                        dstNewValueNumber = NewValueNumber();
                    }
                    newDstValue = CopyValue(dstVal, dstNewValueNumber);
                    break;
                }

                newDstValue = CopyValue(dstVal, dstValueNumber);
            } while(false);

            hoistBlockData.SetValue(newDstValue, dstVarSym);
        }
        return;
    }

#if DBG
    if(instr->GetSrc1()->IsRegOpnd()) // Type spec conversion may load a constant into a dst sym
    {
        StackSym *const srcSym = instr->GetSrc1()->AsRegOpnd()->m_sym;
        Assert(srcSym != dstSym); // Type spec conversion must be changing the type, so the syms must be different
        StackSym *const srcVarSym = srcSym->IsTypeSpec() ? srcSym->GetVarEquivSym(nullptr) : srcSym;
        Assert(srcVarSym == dstVarSym); // Type spec conversion must be between variants of the same var sym
    }
#endif

    bool changeValueType = false, changeValueTypeToInt = false;
    if(dstSym->IsTypeSpec())
    {
        if(dst->IsInt32())
        {
            if(!lossy)
            {
                Assert(
                    !instr->HasBailOutInfo() ||
                    instr->GetBailOutKind() == IR::BailOutIntOnly ||
                    instr->GetBailOutKind() == IR::BailOutExpectingInteger);
                changeValueType = changeValueTypeToInt = true;
            }
        }
        else if (dst->IsFloat64())
        {
            if(instr->HasBailOutInfo() && instr->GetBailOutKind() == IR::BailOutNumberOnly)
            {
                changeValueType = true;
            }
        }
    }

    ValueInfo *previousValueInfoBeforeUpdate = nullptr, *previousValueInfoAfterUpdate = nullptr;
    for(InvariantBlockBackwardIterator it(
            this,
            block,
            loop->landingPad,
            dstVarSym,
            dstVal->GetValueNumber());
        it.IsValid();
        it.MoveNext())
    {
        BasicBlock *const hoistBlock = it.Block();
        GlobOptBlockData &hoistBlockData = hoistBlock->globOptData;

    #if DBG
        // TODO: There are some odd cases with field hoisting where the sym is invariant in only part of the loop and the info
        // does not flow through all blocks. Un-comment the verification below after PRE replaces field hoisting.

        //// Verify that the src sym is live as the required type, and that the conversion is valid
        //Assert(IsLive(dstVarSym, &hoistBlockData));
        //if(instr->GetSrc1()->IsRegOpnd())
        //{
        //    IR::RegOpnd *const src = instr->GetSrc1()->AsRegOpnd();
        //    StackSym *const srcSym = instr->GetSrc1()->AsRegOpnd()->m_sym;
        //    if(srcSym->IsTypeSpec())
        //    {
        //        if(src->IsInt32())
        //        {
        //            Assert(hoistBlockData.liveInt32Syms->Test(dstVarSym->m_id));
        //            Assert(!hoistBlockData.liveLossyInt32Syms->Test(dstVarSym->m_id)); // shouldn't try to convert a lossy int32 to anything
        //        }
        //        else
        //        {
        //            Assert(src->IsFloat64());
        //            Assert(hoistBlockData.liveFloat64Syms->Test(dstVarSym->m_id));
        //            if(dstSym->IsTypeSpec() && dst->IsInt32())
        //            {
        //                Assert(lossy); // shouldn't try to do a lossless conversion from float64 to int32
        //            }
        //        }
        //    }
        //    else
        //    {
        //        Assert(hoistBlockData.liveVarSyms->Test(dstVarSym->m_id));
        //    }
        //}
        //if(dstSym->IsTypeSpec() && dst->IsInt32())
        //{
        //    // If the sym is already specialized as required in the block to which we are attempting to hoist the conversion,
        //    // that info should have flowed into this block
        //    if(lossy)
        //    {
        //        Assert(!hoistBlockData.liveInt32Syms->Test(dstVarSym->m_id));
        //    }
        //    else
        //    {
        //        Assert(!IsInt32TypeSpecialized(dstVarSym, hoistBlock));
        //    }
        //}
    #endif

        hoistBlockData.MakeLive(dstSym, lossy);

        if(!changeValueType)
        {
            continue;
        }

        Value *const hoistBlockValue = it.InvariantSymValue();
        ValueInfo *const hoistBlockValueInfo = hoistBlockValue->GetValueInfo();
        if(hoistBlockValueInfo == previousValueInfoBeforeUpdate)
        {
            if(hoistBlockValueInfo != previousValueInfoAfterUpdate)
            {
                HoistInvariantValueInfo(previousValueInfoAfterUpdate, hoistBlockValue, hoistBlock);
            }
        }
        else
        {
            previousValueInfoBeforeUpdate = hoistBlockValueInfo;
            ValueInfo *const newValueInfo =
                changeValueTypeToInt
                    ? hoistBlockValueInfo->SpecializeToInt32(alloc)
                    : hoistBlockValueInfo->SpecializeToFloat64(alloc);
            previousValueInfoAfterUpdate = newValueInfo;
            ChangeValueInfo(changeValueTypeToInt ? nullptr : hoistBlock, hoistBlockValue, newValueInfo);
        }
    }
}